

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmTextureCalc::GetDisplayFrameOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = 1;
  if (pReqInfo != (GMM_REQ_OFFSET_INFO *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    if (pReqInfo->Frame == GMM_DISPLAY_R) {
      lVar2 = 0x1c4;
    }
    else {
      if (pReqInfo->Frame != GMM_DISPLAY_BLANK_AREA) {
        return 0;
      }
      lVar2 = 0x1c8;
    }
    uVar1 = *(uint32_t *)(pTexInfo->MmcMode + lVar2 + -0x70);
  }
  return uVar1;
}

Assistant:

uint32_t GmmLib::GmmTextureCalc::GetDisplayFrameOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                       GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t Offset;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    switch(pReqInfo->Frame)
    {
        case GMM_DISPLAY_L:
            Offset = 0;
            break;
        case GMM_DISPLAY_R:
            Offset = pTexInfo->S3d.RFrameOffset;
            break;
        case GMM_DISPLAY_BLANK_AREA:
            Offset = pTexInfo->S3d.BlankAreaOffset;
            break;
        default:
            Offset = 0;
            GMM_ASSERTDPF(0, "Unknown Frame Type!");
            break;
    }

    return Offset;
}